

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
::Action(Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
         *this,ActionInterface<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
               *impl)

{
  ActionAdapter local_28;
  ActionInterface<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  *local_18;
  ActionInterface<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  *impl_local;
  Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
                *)this;
  std::
  shared_ptr<testing::ActionInterface<int(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&)>>
  ::
  shared_ptr<testing::ActionInterface<int(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&)>,void>
            ((shared_ptr<testing::ActionInterface<int(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&)>>
              *)&local_28,impl);
  std::function<int(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&)>::
  function<testing::Action<int(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&)>::ActionAdapter,void>
            ((function<int(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&)>
              *)this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}